

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Minisat::SimpSolver::strengthenClause(SimpSolver *this,CRef cr,Lit l)

{
  Lit p;
  Lit p_00;
  bool bVar1;
  int iVar2;
  CRef CVar3;
  SimpSolver *this_00;
  FILE *t;
  SimpSolver *this_01;
  int *piVar4;
  Lit in_EDX;
  FILE *in_RDI;
  CRef in_stack_0000000c;
  Solver *in_stack_00000010;
  bool in_stack_0000002b;
  CRef in_stack_0000002c;
  Solver *in_stack_00000030;
  Clause *c;
  Solver *in_stack_000001f0;
  undefined4 in_stack_ffffffffffffff98;
  Ref in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  bool bVar5;
  FILE *in_stack_ffffffffffffffa8;
  Var v;
  vec<unsigned_int> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  CRef in_stack_ffffffffffffffc4;
  Lit in_stack_ffffffffffffffc8;
  Lit in_stack_ffffffffffffffcc;
  Lit in_stack_ffffffffffffffd4;
  Lit in_stack_ffffffffffffffdc;
  
  this_00 = (SimpSolver *)
            ClauseAllocator::operator[]
                      ((ClauseAllocator *)
                       CONCAT17(in_stack_ffffffffffffffa7,
                                CONCAT16(in_stack_ffffffffffffffa6,
                                         CONCAT24(in_stack_ffffffffffffffa4,
                                                  in_stack_ffffffffffffffa0))),
                       in_stack_ffffffffffffff9c);
  *(long *)(in_RDI + 0x200) = *(long *)(in_RDI + 0x200) + 1;
  Queue<unsigned_int>::insert((Queue<unsigned_int> *)this_00,in_stack_ffffffffffffffdc.x);
  if (*(long *)(in_RDI + 0x28) != 0) {
    in_stack_ffffffffffffffdc.x = in_EDX.x;
    Solver::binDRUP_strengthen
              ((Solver *)CONCAT44(in_stack_ffffffffffffffcc.x,in_stack_ffffffffffffffc8.x),
               (Clause *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffd4,in_RDI);
  }
  iVar2 = Clause::size((Clause *)this_00);
  if (iVar2 == 2) {
    removeClause(this_00,in_stack_ffffffffffffffdc.x);
    p.x._2_1_ = in_stack_ffffffffffffffa6;
    p.x._0_2_ = in_stack_ffffffffffffffa4;
    p.x._3_1_ = in_stack_ffffffffffffffa7;
    Clause::strengthen((Clause *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),p);
    in_EDX.x = in_stack_ffffffffffffffc4;
  }
  else {
    if (*(long *)(in_RDI + 0x28) != 0) {
      Solver::binDRUP<Minisat::Clause>
                ((Solver *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (uchar)((ulong)in_RDI >> 0x38),(Clause *)in_stack_ffffffffffffffb0,
                 in_stack_ffffffffffffffa8);
    }
    Solver::detachClause(in_stack_00000030,in_stack_0000002c,in_stack_0000002b);
    p_00.x._2_1_ = in_stack_ffffffffffffffa6;
    p_00.x._0_2_ = in_stack_ffffffffffffffa4;
    p_00.x._3_1_ = in_stack_ffffffffffffffa7;
    in_stack_ffffffffffffffd4.x = in_EDX.x;
    Clause::strengthen((Clause *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),p_00)
    ;
    Solver::attachClause(in_stack_00000010,in_stack_0000000c);
    t = in_RDI + 0x1458;
    in_stack_ffffffffffffffcc.x = in_EDX.x;
    var(in_EDX);
    OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::operator[]
              ((OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted> *)
               CONCAT17(in_stack_ffffffffffffffa7,
                        CONCAT16(in_stack_ffffffffffffffa6,
                                 CONCAT24(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))),
               (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    remove<Minisat::vec<unsigned_int>,unsigned_int>(in_stack_ffffffffffffffb0,(uint *)t);
    v = (Var)((ulong)t >> 0x20);
    this_01 = (SimpSolver *)(in_RDI + 0x1490);
    in_stack_ffffffffffffffc8.x = in_EDX.x;
    iVar2 = toInt(in_EDX);
    piVar4 = vec<int>::operator[]((vec<int> *)this_01,iVar2);
    *piVar4 = *piVar4 + -1;
    var(in_EDX);
    updateElimHeap(this_01,v);
  }
  iVar2 = Clause::size((Clause *)this_00);
  if (iVar2 == 1) {
    Clause::operator[]((Clause *)this_00,0);
    bVar1 = Solver::enqueue((Solver *)
                            CONCAT44(in_stack_ffffffffffffffcc.x,in_stack_ffffffffffffffc8.x),
                            in_stack_ffffffffffffffd4,in_EDX.x);
    bVar5 = false;
    if (bVar1) {
      CVar3 = Solver::propagate(in_stack_000001f0);
      bVar5 = CVar3 == 0xffffffff;
    }
  }
  else {
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool SimpSolver::strengthenClause(CRef cr, Lit l)
{
    Clause &c = ca[cr];
    statistics.simpSteps++;
    assert(decisionLevel() == 0);
    assert(use_simplification);

    // FIX: this is too inefficient but would be nice to have (properly implemented)
    // if (!find(subsumption_queue, &c))
    subsumption_queue.insert(cr);

    if (drup_file) {
#ifdef BIN_DRUP
        binDRUP_strengthen(c, l, drup_file);
#else
        for (int i = 0; i < c.size(); i++)
            if (c[i] != l) fprintf(drup_file, "%i ", (var(c[i]) + 1) * (-2 * sign(c[i]) + 1));
        fprintf(drup_file, "0\n");
#endif
    }

    if (c.size() == 2) {
        removeClause(cr);
        c.strengthen(l);
    } else {
        if (drup_file) {
#ifdef BIN_DRUP
            binDRUP('d', c, drup_file);
#else
            fprintf(drup_file, "d ");
            for (int i = 0; i < c.size(); i++) fprintf(drup_file, "%i ", (var(c[i]) + 1) * (-2 * sign(c[i]) + 1));
            fprintf(drup_file, "0\n");
#endif
        }

        detachClause(cr, true);
        c.strengthen(l);
        attachClause(cr);
        remove(occurs[var(l)], cr);
        n_occ[toInt(l)]--;
        updateElimHeap(var(l));
    }

    return c.size() == 1 ? enqueue(c[0]) && propagate() == CRef_Undef : true;
}